

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O2

void __thiscall
COLLADAFW::ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>::allocMemory
          (ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*> *this,size_t capacity,int flags)

{
  FormulaNewParam **ppFVar1;
  
  if (capacity == 0) {
    ppFVar1 = (FormulaNewParam **)0x0;
  }
  else {
    ppFVar1 = (FormulaNewParam **)malloc(capacity * 8);
  }
  this->mData = ppFVar1;
  this->mCount = 0;
  this->mCapacity = capacity;
  this->mFlags = this->mFlags | flags;
  return;
}

Assistant:

void allocMemory ( size_t capacity, int flags = DEFAULT_ALLOC_FLAGS )
		{
			if ( capacity == 0 )
				setData ( 0, 0, 0 );
			else
				setData ( ( Type* ) ( malloc ( capacity * sizeof (Type) ) ), 0, capacity );
			mFlags |= flags;
		}